

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O0

int32_t zng_gzdirect(gzFile file)

{
  gz_state *in_RDI;
  gz_state *state;
  int32_t local_4;
  
  if (in_RDI == (gz_state *)0x0) {
    local_4 = 0;
  }
  else {
    if (((in_RDI->mode == 0x1c4f) && (in_RDI->how == 0)) && ((in_RDI->x).have == 0)) {
      gz_look(in_RDI);
    }
    local_4 = in_RDI->direct;
  }
  return local_4;
}

Assistant:

int Z_EXPORT PREFIX(gzdirect)(gzFile file) {
    gz_state *state;

    /* get internal structure */
    if (file == NULL)
        return 0;

    state = (gz_state *)file;

    /* if the state is not known, but we can find out, then do so (this is
       mainly for right after a gzopen() or gzdopen()) */
    if (state->mode == GZ_READ && state->how == LOOK && state->x.have == 0)
        (void)gz_look(state);

    /* return 1 if transparent, 0 if processing a gzip stream */
    return state->direct;
}